

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O1

Program __thiscall
soul::Compiler::build(Compiler *this,CompileMessageList *messageList,BuildBundle *bundle)

{
  byte bVar1;
  pointer pSVar2;
  UnicodeChar UVar3;
  RefCountedPtr<soul::Program::ProgramImpl> extraout_RDX;
  pointer pSVar4;
  byte unaff_BPL;
  char *pcVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Program PVar7;
  UTF8Reader t;
  CompileMessageHandler handler;
  Compiler c;
  ArrayWithPreallocation<soul::CodeLocation,_4UL> heartFiles;
  UTF8Reader local_200;
  BuildSettings *local_1f8;
  pointer local_1f0;
  CodeLocation local_1e8;
  CodeLocation local_1d8;
  CodeLocation local_1c8;
  _Any_data local_1b8;
  code *local_1a8;
  code *local_1a0;
  undefined8 local_198;
  undefined1 local_188 [8];
  UTF8Reader UStack_180;
  pointer local_178;
  Pool *local_170;
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_168;
  undefined1 local_150 [16];
  vector<soul::SourceFile,_std::allocator<soul::SourceFile>_> local_140;
  Value VStack_128;
  undefined1 local_c0 [88];
  CompileMessage local_68;
  
  local_1f8 = &bundle->settings;
  sanityCheckBuildSettings(local_1f8,(uint32_t)messageList,(uint32_t)bundle);
  local_c0._0_8_ = local_c0 + 0x18;
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 4;
  pSVar4 = (bundle->sourceFiles).
           super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1f0 = (bundle->sourceFiles).
              super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (pSVar4 != local_1f0) {
    do {
      CodeLocation::createFromSourceFile((CodeLocation *)local_188,pSVar4);
      local_200.data = UStack_180.data;
      while( true ) {
        if ((4 < (byte)*local_200.data - 9) && (*local_200.data != 0x20)) break;
        UTF8Reader::operator++(&local_200);
      }
      local_1b8._M_unused._M_function_pointer = (_func_void *)local_200.data;
      pcVar5 = "#SOUL";
      do {
        bVar1 = *pcVar5;
        if (bVar1 == 0) {
          bVar6 = false;
          unaff_BPL = 1;
        }
        else {
          UVar3 = UTF8Reader::getAndAdvance((UTF8Reader *)&local_1b8);
          bVar6 = UVar3 == bVar1;
          unaff_BPL = unaff_BPL & bVar6;
        }
        pcVar5 = (char *)((byte *)pcVar5 + 1);
      } while (bVar6);
      if (unaff_BPL != 0) {
        ArrayWithPreallocation<soul::CodeLocation,_4UL>::push_back
                  ((ArrayWithPreallocation<soul::CodeLocation,_4UL> *)local_c0,
                   (CodeLocation *)local_188);
      }
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_188);
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 != local_1f0);
  }
  if (local_c0._8_8_ == 0) {
    Compiler((Compiler *)local_188,
             (bundle->settings).overrideStandardLibrary.
             super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
             super__Vector_impl_data._M_start ==
             (bundle->settings).overrideStandardLibrary.
             super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
             super__Vector_impl_data._M_finish);
    pSVar4 = (bundle->settings).overrideStandardLibrary.
             super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar2 = (bundle->settings).overrideStandardLibrary.
             super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pSVar4 != pSVar2) {
      do {
        CodeLocation::createFromSourceFile(&local_1c8,pSVar4);
        bVar6 = addCode((Compiler *)local_188,messageList,&local_1c8);
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_1c8.sourceCode.object);
        if (!bVar6) {
          Program::Program((Program *)this);
          if (!bVar6) goto LAB_001ac91a;
        }
        pSVar4 = pSVar4 + 1;
      } while (pSVar4 != pSVar2);
    }
    pSVar4 = (bundle->sourceFiles).
             super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar2 = (bundle->sourceFiles).
             super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pSVar4 != pSVar2) {
      do {
        CodeLocation::createFromSourceFile(&local_1d8,pSVar4);
        bVar6 = addCode((Compiler *)local_188,messageList,&local_1d8);
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_1d8.sourceCode.object);
        if (!bVar6) {
          Program::Program((Program *)this);
          if (!bVar6) goto LAB_001ac91a;
        }
        pSVar4 = pSVar4 + 1;
      } while (pSVar4 != pSVar2);
    }
    link(this,local_188,(char *)messageList);
LAB_001ac91a:
    local_150._0_8_ = &PTR__StringDictionary_002d3a30;
    std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>::
    ~vector((vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_> *)
            (local_150 + 8));
    std::
    vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~vector(&local_168);
    std::
    vector<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
    ::~vector((vector<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
               *)local_188);
  }
  else {
    if ((local_c0._8_8_ != 1) ||
       (1 < (ulong)((long)(bundle->sourceFiles).
                          super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(bundle->sourceFiles).
                          super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 6))) {
      local_188 = (undefined1  [8])0x0;
      UStack_180.data = (char *)0x0;
      CompileMessageHelpers::createMessage<>
                (&local_68,syntax,error,
                 "When compiling HEART code, only a single module must be provided");
      CodeLocation::throwError((CodeLocation *)local_188,&local_68);
    }
    local_1e8.sourceCode.object = ((Ptr *)local_c0._0_8_)->object;
    if (local_1e8.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_1e8.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_1e8.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_1e8.location.data = ((UTF8Reader *)(local_c0._0_8_ + 8))->data;
    local_1a0 = std::
                _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:200:30)>
                ::_M_invoke;
    local_1b8._8_8_ = 0;
    local_1a8 = std::
                _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:200:30)>
                ::_M_manager;
    local_198 = *(undefined8 *)(in_FS_OFFSET + -8);
    *(_Any_data **)(in_FS_OFFSET + -8) = &local_1b8;
    local_1b8._M_unused._M_object = messageList;
    heart::Parser::parse((Parser *)this,&local_1e8);
    local_188 = (undefined1  [8])0x0;
    UStack_180.data = UStack_180.data & 0xffffffff00000000;
    local_178 = (pointer)0x1400000;
    local_170 = (Pool *)0x1400000;
    local_168.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0xffffffff;
    local_168.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_150._0_8_ = local_150._0_8_ & 0xffffffffffffff00;
    VStack_128.value.stringDictionary = &VStack_128.dictionary.super_StringDictionary;
    local_140.super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_140.super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_140.super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    VStack_128.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    VStack_128.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    VStack_128.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    VStack_128.dictionary.super_StringDictionary._vptr_StringDictionary =
         (_func_int **)&PTR__SimpleStringDictionary_002d4330;
    VStack_128.value.type.content.object = (Object *)0x0;
    VStack_128.value.type.allocator = (Allocator *)0x0;
    VStack_128.value.data = (uint8_t *)0x0;
    VStack_128.dictionary.strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    VStack_128.dictionary.strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    VStack_128.dictionary.strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    VStack_128.dictionary.strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    VStack_128._49_8_ = 0;
    local_168.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_150;
    heart::Checker::sanityCheck((Program *)this,(BuildSettings *)local_188);
    choc::value::Value::~Value(&VStack_128);
    std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>::~vector(&local_140);
    if (local_168.
        super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)local_150) {
      operator_delete(local_168.
                      super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,local_150._0_8_ + 1);
    }
    CompileMessageHandler::~CompileMessageHandler((CompileMessageHandler *)&local_1b8);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_1e8.sourceCode.object);
  }
  ArrayWithPreallocation<soul::CodeLocation,_4UL>::clear
            ((ArrayWithPreallocation<soul::CodeLocation,_4UL> *)local_c0);
  PVar7.refHolder.object = extraout_RDX.object;
  PVar7.pimpl = (ProgramImpl *)this;
  return PVar7;
}

Assistant:

Program Compiler::build (CompileMessageList& messageList, const BuildBundle& bundle)
{
    sanityCheckBuildSettings (bundle.settings);

    auto heartFiles = getHEARTFiles (bundle);

    if (! heartFiles.empty())
    {
        if (heartFiles.size() > 1 || heartFiles.size() < bundle.sourceFiles.size())
            CodeLocation().throwError (Errors::onlyOneHeartFileAllowed());

        return buildHEART (messageList, heartFiles.front());
    }

    Compiler c (bundle.settings.overrideStandardLibrary.empty());

    if (! bundle.settings.overrideStandardLibrary.empty())
        for (auto& file : bundle.settings.overrideStandardLibrary)
            if (! c.addCode (messageList, CodeLocation::createFromSourceFile (file)))
                return {};

    for (auto& file : bundle.sourceFiles)
        if (! c.addCode (messageList, CodeLocation::createFromSourceFile (file)))
            return {};

    return c.link (messageList, bundle.settings);
}